

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall Reducer::reduceFunctions(Reducer *this)

{
  bool bVar1;
  pointer pMVar2;
  pointer __x;
  size_t sVar3;
  ostream *poVar4;
  size_type sVar5;
  reference pvVar6;
  size_type sVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  unsigned_long *puVar11;
  long lVar12;
  ulong __n;
  Name NVar13;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar14;
  bool local_1fa;
  byte local_199;
  unsigned_long local_150;
  ulong local_148;
  unsigned_long local_140;
  unsigned_long local_138;
  byte local_129;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_128;
  vector<wasm::Name,_std::allocator<wasm::Name>_> local_110;
  _Node_iterator_base<wasm::Name,_true> local_f8;
  undefined1 local_f0;
  char *local_e8;
  size_t sStack_e0;
  undefined1 auStack_d8 [8];
  value_type name;
  size_t j;
  vector<wasm::Name,_std::allocator<wasm::Name>_> names;
  size_t i;
  size_t x;
  size_t base;
  unsigned_long uStack_80;
  bool justReduced;
  size_t maxSkip;
  size_t skip;
  size_type local_68;
  size_type numFuncs;
  reference local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1;
  vector<wasm::Name,_std::allocator<wasm::Name>_> functionNames;
  Reducer *this_local;
  
  functionNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1);
  pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                     (&this->module);
  __end1 = std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::begin(&pMVar2->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&pMVar2->functions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                     *)&func), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
               ::operator*(&__end1);
    __x = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                    (local_50);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1,(value_type *)__x);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1);
  }
  local_68 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                       ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1);
  if (local_68 == 0) {
    this_local._7_1_ = false;
  }
  else {
    maxSkip = 1;
    uStack_80 = 1;
    base._7_1_ = true;
    sVar3 = deterministicRandom(this,local_68);
    poVar4 = std::operator<<((ostream *)&std::cerr,"|    try to remove functions (base: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
    poVar4 = std::operator<<(poVar4,", decisionCounter: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,this->decisionCounter);
    poVar4 = std::operator<<(poVar4,", numFuncs ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_68);
    std::operator<<(poVar4,")\n");
    for (i = 0; sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1),
        i < sVar5; i = i + 1) {
      __n = (sVar3 + i) % local_68;
      local_199 = 0;
      if (base._7_1_ == false) {
        pvVar6 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1,__n);
        sVar7 = std::
                unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                ::count(&functionsWeTriedToRemove,pvVar6);
        local_199 = 0;
        if (sVar7 == 1) {
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = this->factor / 5 + 1;
          names.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 20000;
          piVar8 = std::max<int>((int *)((long)&names.
                                                super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4),
                                 (int *)&names.
                                         super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar1 = shouldTryToReduce(this,(long)*piVar8);
          local_199 = bVar1 ^ 0xff;
        }
      }
      if ((local_199 & 1) == 0) {
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
        name.super_IString.str._M_str = (char *)0x0;
        while( true ) {
          sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
          bVar1 = false;
          if (sVar5 < maxSkip) {
            pcVar9 = name.super_IString.str._M_str + __n;
            pcVar10 = (char *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                                        ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)
                                         &__range1);
            bVar1 = pcVar9 < pcVar10;
          }
          if (!bVar1) break;
          pvVar6 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                             ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1,
                              (size_type)(name.super_IString.str._M_str + __n));
          auStack_d8 = (undefined1  [8])(pvVar6->super_IString).str._M_len;
          name.super_IString.str._M_len = (size_t)(pvVar6->super_IString).str._M_str;
          pMVar2 = std::unique_ptr<wasm::Module,_std::default_delete<wasm::Module>_>::operator->
                             (&this->module);
          local_e8 = (char *)auStack_d8;
          sStack_e0 = name.super_IString.str._M_len;
          NVar13.super_IString.str._M_str = (char *)auStack_d8;
          NVar13.super_IString.str._M_len = (size_t)pMVar2;
          lVar12 = wasm::Module::getFunctionOrNull(NVar13);
          if (lVar12 != 0) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                      ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j,
                       (value_type *)auStack_d8);
            pVar14 = std::
                     unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                     ::insert(&functionsWeTriedToRemove,(value_type *)auStack_d8);
            local_f8._M_cur =
                 (__node_type *)pVar14.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
            local_f0 = pVar14.second;
          }
          name.super_IString.str._M_str = name.super_IString.str._M_str + 1;
        }
        sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                          ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
        if (sVar5 == 0) {
          skip._4_4_ = 6;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cerr,"|     trying at i=");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,__n);
          poVar4 = std::operator<<(poVar4," of size ");
          sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
          std::operator<<(poVar4,"\n");
          local_129 = 0;
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                    (&local_110,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
          bVar1 = tryToEmptyFunctions(this,&local_110);
          local_1fa = true;
          if (!bVar1) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
                      (&local_128,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
            local_129 = 1;
            local_1fa = tryToRemoveFunctions(this,&local_128);
          }
          base._7_1_ = local_1fa;
          if ((local_129 & 1) != 0) {
            std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_128);
          }
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector(&local_110);
          if (local_1fa == false) {
            local_148 = maxSkip >> 1;
            local_150 = 1;
            puVar11 = std::max<unsigned_long>(&local_148,&local_150);
            maxSkip = *puVar11;
            lVar12 = (long)(this->factor / 100);
          }
          else {
            sVar5 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size
                              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
            noteReduction(this,sVar5);
            lVar12 = maxSkip - 1;
            local_138 = (unsigned_long)this->factor;
            local_140 = maxSkip << 1;
            puVar11 = std::min<unsigned_long>(&local_138,&local_140);
            maxSkip = *puVar11;
            puVar11 = std::max<unsigned_long>(&maxSkip,&stack0xffffffffffffff80);
            uStack_80 = *puVar11;
          }
          i = lVar12 + i;
          skip._4_4_ = 0;
        }
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&j);
      }
    }
    this_local._7_1_ = 2 < uStack_80;
  }
  skip._4_4_ = 1;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range1);
  return this_local._7_1_;
}

Assistant:

bool reduceFunctions() {
    // try to remove functions
    std::vector<Name> functionNames;
    for (auto& func : module->functions) {
      functionNames.push_back(func->name);
    }
    auto numFuncs = functionNames.size();
    if (numFuncs == 0) {
      return false;
    }
    size_t skip = 1;
    size_t maxSkip = 1;
    // If we just removed some functions in the previous iteration, keep trying
    // to remove more as this is one of the most efficient ways to reduce.
    bool justReduced = true;
    // Start from a new place each time.
    size_t base = deterministicRandom(numFuncs);
    std::cerr << "|    try to remove functions (base: " << base
              << ", decisionCounter: " << decisionCounter << ", numFuncs "
              << numFuncs << ")\n";
    for (size_t x = 0; x < functionNames.size(); x++) {
      size_t i = (base + x) % numFuncs;
      if (!justReduced &&
          functionsWeTriedToRemove.count(functionNames[i]) == 1 &&
          !shouldTryToReduce(std::max((factor / 5) + 1, 20000))) {
        continue;
      }
      std::vector<Name> names;
      for (size_t j = 0; names.size() < skip && i + j < functionNames.size();
           j++) {
        auto name = functionNames[i + j];
        if (module->getFunctionOrNull(name)) {
          names.push_back(name);
          functionsWeTriedToRemove.insert(name);
        }
      }
      if (names.size() == 0) {
        continue;
      }
      std::cerr << "|     trying at i=" << i << " of size " << names.size()
                << "\n";
      // Try to remove functions and/or empty them. Note that
      // tryToRemoveFunctions() will reload the module if it fails, which means
      // function names may change - for that reason, run it second.
      justReduced = tryToEmptyFunctions(names) || tryToRemoveFunctions(names);
      if (justReduced) {
        noteReduction(names.size());
        // Subtract 1 since the loop increments us anyhow by one: we want to
        // skip over the skipped functions, and not any more.
        x += skip - 1;
        skip = std::min(size_t(factor), 2 * skip);
        maxSkip = std::max(skip, maxSkip);
      } else {
        skip = std::max(skip / 2, size_t(1)); // or 1?
        x += factor / 100;
      }
    }
    // If maxSkip is 1 then we never reduced at all. If it is 2 then we did
    // manage to reduce individual functions, but all our attempts at
    // exponential growth failed. Only suggest doing a new iteration of this
    // function if we did in fact manage to grow, which indicated there are lots
    // of opportunities here, and it is worth focusing on this.
    return maxSkip > 2;
  }